

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int mbedtls_x509_get_name(uchar **p,uchar *end,mbedtls_x509_name *cur)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  mbedtls_asn1_named_data *pmVar5;
  mbedtls_x509_name *pmVar6;
  byte *end_00;
  uchar *end_01;
  mbedtls_x509_name *pmVar7;
  size_t local_40;
  size_t set_len;
  
  pmVar6 = cur;
LAB_0019435f:
  iVar2 = mbedtls_asn1_get_tag(p,end,&local_40,0x31);
  if (iVar2 == 0) {
    end_01 = *p + local_40;
    pmVar7 = pmVar6;
    do {
      iVar3 = mbedtls_asn1_get_tag(p,end_01,&set_len,0x30);
      if (iVar3 == 0) {
        iVar2 = -0x23e0;
        if ((long)set_len < 1) goto LAB_001944e3;
        end_00 = *p + set_len;
        (pmVar7->oid).tag = (uint)**p;
        iVar3 = mbedtls_asn1_get_tag(p,end_00,&(pmVar7->oid).len,6);
        if (iVar3 != 0) goto LAB_00194446;
        puVar1 = *p;
        (pmVar7->oid).p = puVar1;
        pbVar4 = puVar1 + (pmVar7->oid).len;
        *p = pbVar4;
        if (end_00 == pbVar4 || (long)end_00 - (long)pbVar4 < 0) goto LAB_001944e3;
        iVar2 = -0x23e2;
        if ((0x1e < *pbVar4) || ((0x50581008U >> (*pbVar4 & 0x1f) & 1) == 0)) goto LAB_001944e3;
        *p = pbVar4 + 1;
        (pmVar7->val).tag = (uint)*pbVar4;
        iVar3 = mbedtls_asn1_get_len(p,end_00,&(pmVar7->val).len);
        if (iVar3 != 0) goto LAB_00194446;
        puVar1 = *p;
        (pmVar7->val).p = puVar1;
        pbVar4 = puVar1 + (pmVar7->val).len;
        *p = pbVar4;
        if (pbVar4 != end_00) {
          iVar2 = -0x23e6;
          goto LAB_001944e3;
        }
        pmVar7->next = (mbedtls_asn1_named_data *)0x0;
      }
      else {
LAB_00194446:
        iVar2 = iVar3 + -0x2380;
        if (iVar2 != 0) goto LAB_001944e3;
      }
      if (*p == end_01) goto LAB_0019449b;
      pmVar7->next_merged = '\x01';
      pmVar5 = (mbedtls_asn1_named_data *)calloc(1,0x40);
      pmVar7->next = pmVar5;
      pmVar7 = pmVar5;
      if (pmVar5 == (mbedtls_asn1_named_data *)0x0) goto LAB_001944c6;
    } while( true );
  }
  iVar2 = iVar2 + -0x2380;
  goto LAB_001944e3;
LAB_0019449b:
  if (end_01 == end) {
    return 0;
  }
  pmVar6 = (mbedtls_x509_name *)calloc(1,0x40);
  pmVar7->next = pmVar6;
  if (pmVar6 == (mbedtls_asn1_named_data *)0x0) {
LAB_001944c6:
    iVar2 = -0x2880;
LAB_001944e3:
    mbedtls_asn1_free_named_data_list_shallow(cur->next);
    cur->next = (mbedtls_asn1_named_data *)0x0;
    return iVar2;
  }
  goto LAB_0019435f;
}

Assistant:

int mbedtls_x509_get_name(unsigned char **p, const unsigned char *end,
                          mbedtls_x509_name *cur)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t set_len;
    const unsigned char *end_set;
    mbedtls_x509_name *head = cur;

    /* don't use recursion, we'd risk stack overflow if not optimized */
    while (1) {
        /*
         * parse SET
         */
        if ((ret = mbedtls_asn1_get_tag(p, end, &set_len,
                                        MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SET)) != 0) {
            ret = MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_NAME, ret);
            goto error;
        }

        end_set  = *p + set_len;

        while (1) {
            if ((ret = x509_get_attr_type_value(p, end_set, cur)) != 0) {
                goto error;
            }

            if (*p == end_set) {
                break;
            }

            /* Mark this item as being no the only one in a set */
            cur->next_merged = 1;

            cur->next = mbedtls_calloc(1, sizeof(mbedtls_x509_name));

            if (cur->next == NULL) {
                ret = MBEDTLS_ERR_X509_ALLOC_FAILED;
                goto error;
            }

            cur = cur->next;
        }

        /*
         * continue until end of SEQUENCE is reached
         */
        if (*p == end) {
            return 0;
        }

        cur->next = mbedtls_calloc(1, sizeof(mbedtls_x509_name));

        if (cur->next == NULL) {
            ret = MBEDTLS_ERR_X509_ALLOC_FAILED;
            goto error;
        }

        cur = cur->next;
    }

error:
    /* Skip the first element as we did not allocate it */
    mbedtls_asn1_free_named_data_list_shallow(head->next);
    head->next = NULL;

    return ret;
}